

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adapter.cpp
# Opt level: O0

void msocket::set_handler(msocket_t *msocket,Handler *handler)

{
  undefined1 local_48 [8];
  msocket_handler_t handler_struct;
  Handler *handler_local;
  msocket_t *msocket_local;
  
  if ((msocket != (msocket_t *)0x0) && (handler != (Handler *)0x0)) {
    handler_struct.tcp_inactivity = (_func_void_uint32_t *)handler;
    memset(local_48,0,0x30);
    handler_struct.udp_msg = msocket_adapter_tcp_connected;
    handler_struct.tcp_connected = msocket_adapter_tcp_disconnected;
    handler_struct.tcp_disconnected = msocket_adapter_tcp_data;
    msocket_set_handler(msocket,local_48,handler_struct.tcp_inactivity);
  }
  return;
}

Assistant:

void set_handler(msocket_t* msocket, Handler* handler)
   {
      if ((msocket != nullptr) && (handler != nullptr))
      {
         msocket_handler_t handler_struct;
         std::memset(&handler_struct, 0, sizeof(handler_struct));
         handler_struct.tcp_connected = msocket_adapter_tcp_connected;
         handler_struct.tcp_disconnected = msocket_adapter_tcp_disconnected;
         handler_struct.tcp_data = msocket_adapter_tcp_data;
         msocket_set_handler(msocket, &handler_struct, reinterpret_cast<void*>(handler));
      }
   }